

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

void QtPrivate::QDebugStreamOperatorForType<QJsonValue,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  long in_FS_OFFSET;
  QJsonValue local_20;
  
  local_20.value._16_8_ = *(long *)(in_FS_OFFSET + 0x28);
  local_20.value.n = (qint64)dbg->stream;
  ((Stream *)local_20.value.n)->ref = ((Stream *)local_20.value.n)->ref + 1;
  ::operator<<((QDebug)&local_20.value.container,&local_20);
  QDebug::~QDebug((QDebug *)&local_20.value.container);
  QDebug::~QDebug((QDebug *)&local_20);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20.value._16_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }